

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O2

string * __thiscall
duckdb::DecimalStatsUnifier<int>::StatsToString
          (string *__return_storage_ptr__,DecimalStatsUnifier<int> *this,string *stats)

{
  Value local_50;
  
  if (stats->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    Value::DECIMAL(&local_50,*(int32_t *)(stats->_M_dataplus)._M_p,this->width,this->scale);
    Value::ToString_abi_cxx11_(__return_storage_ptr__,&local_50);
    Value::~Value(&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

string StatsToString(const string &stats) override {
		if (stats.empty()) {
			return string();
		}
		auto numeric_val = Load<T>(const_data_ptr_cast(stats.data()));
		return Value::DECIMAL(numeric_val, width, scale).ToString();
	}